

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O2

void __thiscall
ReplayInterface::set_application_info
          (ReplayInterface *this,Hash hash,VkApplicationInfo *info,
          VkPhysicalDeviceFeatures2 *features)

{
  bool bVar1;
  Hash HVar2;
  StateRecorderApplicationFeatureHash local_30;
  
  local_30 = Fossilize::Hashing::compute_application_feature_hash(info,features);
  HVar2 = Fossilize::Hashing::compute_combined_application_feature_hash(&local_30);
  this->feature_hash = HVar2;
  if (HVar2 == hash) {
    if (info != (VkApplicationInfo *)0x0) {
      bVar1 = Fossilize::StateRecorder::record_application_info(&this->recorder,info);
      if (!bVar1) goto LAB_00113abb;
    }
    if (features != (VkPhysicalDeviceFeatures2 *)0x0) {
      bVar1 = Fossilize::StateRecorder::record_physical_device_features(&this->recorder,features);
      if (!bVar1) goto LAB_00113abb;
    }
    return;
  }
LAB_00113abb:
  abort();
}

Assistant:

void set_application_info(Hash hash, const VkApplicationInfo *info, const VkPhysicalDeviceFeatures2 *features) override
	{
		feature_hash = Hashing::compute_combined_application_feature_hash(Hashing::compute_application_feature_hash(info, features));
		if (feature_hash != hash)
			abort();

		if (info)
			if (!recorder.record_application_info(*info))
				abort();
		if (features)
			if (!recorder.record_physical_device_features(features))
				abort();
	}